

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

fixed_precise_measurement * units::root(fixed_precise_measurement *fpm,int power)

{
  fixed_precise_measurement *in_RSI;
  fixed_precise_measurement *in_RDI;
  double val;
  precise_unit pVar1;
  double in_stack_ffffffffffffffb8;
  fixed_precise_measurement *un;
  precise_unit local_28;
  fixed_precise_measurement *local_10;
  
  un = in_RDI;
  local_10 = in_RSI;
  fixed_precise_measurement::value(in_RSI);
  val = numericalRoot<double>(in_stack_ffffffffffffffb8,(int)((ulong)in_RDI >> 0x20));
  fixed_precise_measurement::units(local_10);
  pVar1 = root((precise_unit *)un,(int)((ulong)val >> 0x20));
  local_28._8_8_ = pVar1._8_8_;
  local_28.multiplier_ = pVar1.multiplier_;
  fixed_precise_measurement::fixed_precise_measurement(in_RDI,val,&local_28);
  return un;
}

Assistant:

fixed_precise_measurement root(const fixed_precise_measurement& fpm, int power)
{
    return {numericalRoot(fpm.value(), power), root(fpm.units(), power)};
}